

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmldoc.cpp
# Opt level: O0

void __thiscall libcellml::XmlDoc::parse(XmlDoc *this,string *input)

{
  long lVar1;
  undefined8 uVar2;
  xmlDocPtr pxVar3;
  xmlParserCtxtPtr context;
  string *input_local;
  XmlDoc *this_local;
  
  xmlInitParser();
  lVar1 = xmlNewParserCtxt();
  *(XmlDoc **)(lVar1 + 0x1a8) = this;
  xmlSetStructuredErrorFunc(lVar1,structuredErrorCallback);
  uVar2 = std::__cxx11::string::c_str();
  pxVar3 = (xmlDocPtr)xmlCtxtReadDoc(lVar1,uVar2,"/",0,0);
  this->mPimpl->mXmlDocPtr = pxVar3;
  xmlFreeParserCtxt(lVar1);
  xmlSetStructuredErrorFunc(0);
  xmlCleanupParser();
  return;
}

Assistant:

void XmlDoc::parse(const std::string &input)
{
    xmlInitParser();
    xmlParserCtxtPtr context = xmlNewParserCtxt();
    context->_private = reinterpret_cast<void *>(this);
    xmlSetStructuredErrorFunc(context, structuredErrorCallback);
    mPimpl->mXmlDocPtr = xmlCtxtReadDoc(context, reinterpret_cast<const xmlChar *>(input.c_str()), "/", nullptr, 0);
    xmlFreeParserCtxt(context);
    xmlSetStructuredErrorFunc(nullptr, nullptr);
    xmlCleanupParser();
}